

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O2

event_set * __thiscall
afsm::transitions::
state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
::current_handled_events
          (event_set *__return_storage_ptr__,
          state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
          *this)

{
  current_events_table *pcVar1;
  available_transtions_table *paVar2;
  indexes_tuple<0UL,_1UL> local_12;
  indexes_tuple<0UL,_1UL> local_11;
  
  pcVar1 = state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,afsm::test::ortho_sm_def,unsigned_long>
           ::get_current_events_table<0ul,1ul>(&local_11);
  std::
  function<std::set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>_(const_std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::ortho_sm_def::off,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_&)>
  ::operator()(__return_storage_ptr__,pcVar1->_M_elems + this->current_state_,&this->states_);
  paVar2 = state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,afsm::test::ortho_sm_def,unsigned_long>
           ::get_available_transitions_table<0ul,1ul>(&local_12);
  std::
  _Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<afsm::detail::event_base::id_type_const*>>
            ((_Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
              *)__return_storage_ptr__,
             paVar2->_M_elems[this->current_state_]._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left,(_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>)
                     &paVar2->_M_elems[this->current_state_]._M_t._M_impl.super__Rb_tree_header);
  return __return_storage_ptr__;
}

Assistant:

event_set
    current_handled_events() const
    {
        auto const& table = get_current_events_table(state_indexes{});
        auto res = table[current_state_](states_);
        auto const& available_transitions
                            = get_available_transitions_table(state_indexes{});
        auto const& trans = available_transitions[current_state_];
        res.insert( trans.begin(), trans.end());
        return res;
    }